

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTestLog.hpp
# Opt level: O0

void __thiscall tcu::LogSampleList::~LogSampleList(LogSampleList *this)

{
  LogSampleList *this_local;
  
  std::__cxx11::string::~string((string *)&this->m_description);
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

LogSampleList (const std::string& name, const std::string& description)
		: m_name		(name)
		, m_description	(description)
	{
	}